

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

bool __thiscall DynamicGraph::checkComponentBreak(DynamicGraph *this,Vertex *v,Vertex *u)

{
  allocator<bool> *paVar1;
  bool bVar2;
  vertices_size_type vVar3;
  byte local_161;
  reference local_110;
  reference local_100;
  undefined1 local_f0 [8];
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListU;
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListV;
  undefined1 local_b8 [8];
  vector<bool,_std::allocator<bool>_> visitedU;
  undefined1 local_80 [8];
  vector<bool,_std::allocator<bool>_> visitedV;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueU;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueV;
  Vertex *u_local;
  Vertex *v_local;
  DynamicGraph *this_local;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &queueU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
              ._M_size);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &visitedV.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  vVar3 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                      *)this);
  visitedU.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  paVar1 = (allocator<bool> *)
           ((long)&visitedU.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage + 2);
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_80,vVar3,
             (bool *)((long)&visitedU.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 3),paVar1);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&visitedU.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 2));
  vVar3 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                      *)this);
  visitedListV.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  _M_size._7_1_ = 0;
  paVar1 = (allocator<bool> *)
           ((long)&visitedListV.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl._M_node._M_size + 6);
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_b8,vVar3,
             (bool *)((long)&visitedListV.
                             super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                             ._M_node._M_size + 7),paVar1);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&visitedListV.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl._M_node._M_size + 6));
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &visitedListU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node._M_size);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  local_100 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_80,*v);
  std::_Bit_reference::operator=(&local_100,true);
  local_110 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_b8,*u);
  std::_Bit_reference::operator=(&local_110,true);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &queueU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
              ._M_size,v);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &visitedV.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,u);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &visitedListU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node._M_size,v);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,u);
  do {
    bVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &queueU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl._M_node._M_size);
    local_161 = 0;
    if (!bVar2) {
      bVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &visitedV.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
      local_161 = bVar2 ^ 0xff;
    }
    if ((local_161 & 1) == 0) goto LAB_001167c6;
    if ((this->halt & 1U) != 0) {
      this_local._7_1_ = false;
      goto LAB_001167d4;
    }
    bVar2 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &queueU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl._M_node._M_size,(vector<bool,_std::allocator<bool>_> *)local_80,
                      (vector<bool,_std::allocator<bool>_> *)local_b8,
                      (list<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &visitedListU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl._M_node._M_size);
    if ((!bVar2) || ((this->halt & 1U) != 0)) {
      this_local._7_1_ = false;
      goto LAB_001167d4;
    }
    bVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &queueU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl._M_node._M_size);
    if (bVar2) {
      this->halt = true;
      updateVisitedComponents
                (this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &visitedListU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl._M_node._M_size);
      goto LAB_001167c6;
    }
    bVar2 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &visitedV.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,
                      (vector<bool,_std::allocator<bool>_> *)local_b8,
                      (vector<bool,_std::allocator<bool>_> *)local_80,
                      (list<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
    if ((!bVar2) || ((this->halt & 1U) != 0)) {
      this_local._7_1_ = false;
      goto LAB_001167d4;
    }
    bVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &visitedV.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
  } while (!bVar2);
  this->halt = true;
  updateVisitedComponents(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
LAB_001167c6:
  this_local._7_1_ = true;
LAB_001167d4:
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &visitedListU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node._M_size);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_b8)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_80)
  ;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &visitedV.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &queueU.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
              ._M_size);
  return this_local._7_1_;
}

Assistant:

bool DynamicGraph::checkComponentBreak(const Vertex &v, const Vertex &u)
{
    std::list<Vertex> queueV;
    std::list<Vertex> queueU;
    std::vector<bool> visitedV(boost::num_vertices(*this), false);
    std::vector<bool> visitedU(boost::num_vertices(*this), false);
    std::list<Vertex> visitedListV;
    std::list<Vertex> visitedListU;

    // Using bidirectional BFS
    visitedV[v]=true;
    visitedU[u]=true;
    queueV.push_back(v);
    queueU.push_back(u);
    visitedListV.push_back(v);
    visitedListU.push_back(u);
    while(!queueV.empty() && !queueU.empty()) {
        if (this->halt) {
            return false;
        }

        if(!this->bdbfsStep(queueV, visitedV, visitedU, visitedListV)
           || this->halt) {
            return false;
        }

        if (queueV.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListV);
            break;
        }

        if(!this->bdbfsStep(queueU, visitedU, visitedV, visitedListU)
           || this->halt) {
            return false;
        }

        if (queueU.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListU);
            break;
        }
    }
    return true;
}